

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtBoxBoxCollisionAlgorithm::processCollision
          (cbtBoxBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap,cbtDispatcherInfo *dispatchInfo,
          cbtManifoldResult *resultOut)

{
  cbtCollisionShape *box1;
  cbtCollisionShape *box2;
  cbtTransform *pcVar1;
  cbtPersistentManifold *this_00;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtBoxBoxDetector detector;
  cbtBoxBoxDetector local_d0;
  ClosestPointInput local_b8;
  
  if (this->m_manifoldPtr != (cbtPersistentManifold *)0x0) {
    box1 = body0Wrap->m_shape;
    box2 = body1Wrap->m_shape;
    resultOut->m_manifoldPtr = this->m_manifoldPtr;
    local_b8.m_maximumDistanceSquared = 1e+18;
    pcVar1 = body0Wrap->m_worldTransform;
    local_b8.m_transformA.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(pcVar1->m_basis).m_el[0].m_floats;
    local_b8.m_transformA.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((pcVar1->m_basis).m_el[0].m_floats + 2);
    local_b8.m_transformA.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pcVar1->m_basis).m_el[1].m_floats;
    local_b8.m_transformA.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((pcVar1->m_basis).m_el[1].m_floats + 2);
    local_b8.m_transformA.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pcVar1->m_basis).m_el[2].m_floats;
    local_b8.m_transformA.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((pcVar1->m_basis).m_el[2].m_floats + 2);
    local_b8.m_transformA.m_origin.m_floats._0_8_ = *(undefined8 *)(pcVar1->m_origin).m_floats;
    local_b8.m_transformA.m_origin.m_floats._8_8_ = *(undefined8 *)((pcVar1->m_origin).m_floats + 2)
    ;
    pcVar1 = body1Wrap->m_worldTransform;
    local_b8.m_transformB.m_basis.m_el[0].m_floats._0_8_ =
         *(undefined8 *)(pcVar1->m_basis).m_el[0].m_floats;
    local_b8.m_transformB.m_basis.m_el[0].m_floats._8_8_ =
         *(undefined8 *)((pcVar1->m_basis).m_el[0].m_floats + 2);
    local_b8.m_transformB.m_basis.m_el[1].m_floats._0_8_ =
         *(undefined8 *)(pcVar1->m_basis).m_el[1].m_floats;
    local_b8.m_transformB.m_basis.m_el[1].m_floats._8_8_ =
         *(undefined8 *)((pcVar1->m_basis).m_el[1].m_floats + 2);
    local_b8.m_transformB.m_basis.m_el[2].m_floats._0_8_ =
         *(undefined8 *)(pcVar1->m_basis).m_el[2].m_floats;
    local_b8.m_transformB.m_basis.m_el[2].m_floats._8_8_ =
         *(undefined8 *)((pcVar1->m_basis).m_el[2].m_floats + 2);
    local_b8.m_transformB.m_origin.m_floats._0_8_ = *(undefined8 *)(pcVar1->m_origin).m_floats;
    local_b8.m_transformB.m_origin.m_floats._8_8_ = *(undefined8 *)((pcVar1->m_origin).m_floats + 2)
    ;
    cbtBoxBoxDetector::cbtBoxBoxDetector(&local_d0,(cbtBoxShape *)box1,(cbtBoxShape *)box2);
    cbtBoxBoxDetector::getClosestPoints
              (&local_d0,&local_b8,&resultOut->super_Result,dispatchInfo->m_debugDraw,false);
    if ((this->m_ownManifold == true) &&
       (this_00 = resultOut->m_manifoldPtr, this_00->m_cachedPoints != 0)) {
      pcVar3 = resultOut->m_body0Wrap->m_collisionObject;
      if (this_00->m_body0 == pcVar3) {
        pcVar2 = resultOut->m_body1Wrap->m_collisionObject;
      }
      else {
        pcVar2 = pcVar3;
        pcVar3 = resultOut->m_body1Wrap->m_collisionObject;
      }
      cbtPersistentManifold::refreshContactPoints
                (this_00,&pcVar3->m_worldTransform,&pcVar2->m_worldTransform);
    }
  }
  return;
}

Assistant:

void cbtBoxBoxCollisionAlgorithm::processCollision(const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	if (!m_manifoldPtr)
		return;

	const cbtBoxShape* box0 = (cbtBoxShape*)body0Wrap->getCollisionShape();
	const cbtBoxShape* box1 = (cbtBoxShape*)body1Wrap->getCollisionShape();

	/// report a contact. internally this will be kept persistent, and contact reduction is done
	resultOut->setPersistentManifold(m_manifoldPtr);
#ifndef USE_PERSISTENT_CONTACTS
	m_manifoldPtr->clearManifold();
#endif  //USE_PERSISTENT_CONTACTS

	cbtDiscreteCollisionDetectorInterface::ClosestPointInput input;
	input.m_maximumDistanceSquared = BT_LARGE_FLOAT;
	input.m_transformA = body0Wrap->getWorldTransform();
	input.m_transformB = body1Wrap->getWorldTransform();

	cbtBoxBoxDetector detector(box0, box1);
	detector.getClosestPoints(input, *resultOut, dispatchInfo.m_debugDraw);

#ifdef USE_PERSISTENT_CONTACTS
	//  refreshContactPoints is only necessary when using persistent contact points. otherwise all points are newly added
	if (m_ownManifold)
	{
		resultOut->refreshContactPoints();
	}
#endif  //USE_PERSISTENT_CONTACTS
}